

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall icu_63::RuleChain::dumpRules(RuleChain *this,UnicodeString *result)

{
  int32_t iVar1;
  int iVar2;
  int32_t iVar3;
  ConstChar16Ptr local_658;
  UnicodeString local_650;
  ConstChar16Ptr local_610;
  UnicodeString local_608;
  ConstChar16Ptr local_5c8;
  UnicodeString local_5c0;
  ConstChar16Ptr local_580;
  UnicodeString local_578;
  UnicodeString local_538;
  ConstChar16Ptr local_4f8;
  UnicodeString local_4f0;
  UnicodeString local_4b0;
  uint32_t local_46c;
  uint32_t local_468;
  int32_t rangeHi;
  int32_t rangeLo;
  int32_t r;
  UnicodeString local_458;
  ConstChar16Ptr local_418;
  UnicodeString local_410;
  ConstChar16Ptr local_3d0;
  UnicodeString local_3c8;
  ConstChar16Ptr local_388;
  UnicodeString local_380;
  UnicodeString local_340;
  ConstChar16Ptr local_300;
  UnicodeString local_2f8;
  UnicodeString local_2b8;
  ConstChar16Ptr local_278;
  UnicodeString local_270;
  UnicodeString local_230;
  ConstChar16Ptr local_1f0;
  UnicodeString local_1e8;
  UnicodeString local_1a8;
  UnicodeString local_168;
  ConstChar16Ptr local_128;
  UnicodeString local_120;
  ConstChar16Ptr local_e0;
  UnicodeString local_d8;
  UnicodeString local_88;
  long local_48;
  AndConstraint *andRule;
  OrConstraint *orRule;
  UChar digitString [16];
  UnicodeString *result_local;
  RuleChain *this_local;
  
  digitString._24_8_ = result;
  if (this->ruleHeader != (OrConstraint *)0x0) {
    UnicodeString::operator+=(result,&this->fKeyword);
    UnicodeString::operator+=((UnicodeString *)digitString._24_8_,L':');
    UnicodeString::operator+=((UnicodeString *)digitString._24_8_,L' ');
    andRule = (AndConstraint *)this->ruleHeader;
    while (andRule != (AndConstraint *)0x0) {
      local_48._0_4_ = andRule->op;
      local_48._4_4_ = andRule->opNum;
      while (local_48 != 0) {
        if (((*(int *)(local_48 + 8) != 0) || (*(long *)(local_48 + 0x18) != 0)) ||
           (*(int *)(local_48 + 0x10) != -1)) {
          if ((*(int *)(local_48 + 8) == 0) && (*(long *)(local_48 + 0x18) == 0)) {
            tokenString(&local_88,*(tokenType *)(local_48 + 0x24));
            UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_88);
            UnicodeString::~UnicodeString(&local_88);
            ConstChar16Ptr::ConstChar16Ptr(&local_e0,L" is ");
            UnicodeString::UnicodeString(&local_d8,'\x01',&local_e0,-1);
            UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_d8);
            UnicodeString::~UnicodeString(&local_d8);
            ConstChar16Ptr::~ConstChar16Ptr(&local_e0);
            if (*(char *)(local_48 + 0x20) != '\0') {
              ConstChar16Ptr::ConstChar16Ptr(&local_128,L"not ");
              UnicodeString::UnicodeString(&local_120,'\x01',&local_128,-1);
              UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_120);
              UnicodeString::~UnicodeString(&local_120);
              ConstChar16Ptr::~ConstChar16Ptr(&local_128);
            }
            uprv_itou_63((UChar *)&orRule,0x10,*(uint32_t *)(local_48 + 0x10),10,0);
            UnicodeString::UnicodeString(&local_168,(UChar *)&orRule);
            UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_168);
            UnicodeString::~UnicodeString(&local_168);
          }
          else {
            tokenString(&local_1a8,*(tokenType *)(local_48 + 0x24));
            UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_1a8);
            UnicodeString::~UnicodeString(&local_1a8);
            UnicodeString::operator+=((UnicodeString *)digitString._24_8_,L' ');
            if (*(int *)(local_48 + 8) == 1) {
              ConstChar16Ptr::ConstChar16Ptr(&local_1f0,L"mod ");
              UnicodeString::UnicodeString(&local_1e8,'\x01',&local_1f0,-1);
              UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_1e8);
              UnicodeString::~UnicodeString(&local_1e8);
              ConstChar16Ptr::~ConstChar16Ptr(&local_1f0);
              uprv_itou_63((UChar *)&orRule,0x10,*(uint32_t *)(local_48 + 0xc),10,0);
              UnicodeString::UnicodeString(&local_230,(UChar *)&orRule);
              UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_230);
              UnicodeString::~UnicodeString(&local_230);
            }
            if (*(long *)(local_48 + 0x18) == 0) {
              if (*(char *)(local_48 + 0x20) == '\0') {
                ConstChar16Ptr::ConstChar16Ptr(&local_300,L" is ");
                UnicodeString::UnicodeString(&local_2f8,'\x01',&local_300,-1);
                UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_2f8);
                UnicodeString::~UnicodeString(&local_2f8);
                ConstChar16Ptr::~ConstChar16Ptr(&local_300);
                uprv_itou_63((UChar *)&orRule,0x10,*(uint32_t *)(local_48 + 0x10),10,0);
                UnicodeString::UnicodeString(&local_340,(UChar *)&orRule);
                UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_340);
                UnicodeString::~UnicodeString(&local_340);
              }
              else {
                ConstChar16Ptr::ConstChar16Ptr(&local_278,L" is not ");
                UnicodeString::UnicodeString(&local_270,'\x01',&local_278,-1);
                UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_270);
                UnicodeString::~UnicodeString(&local_270);
                ConstChar16Ptr::~ConstChar16Ptr(&local_278);
                uprv_itou_63((UChar *)&orRule,0x10,*(uint32_t *)(local_48 + 0x10),10,0);
                UnicodeString::UnicodeString(&local_2b8,(UChar *)&orRule);
                UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_2b8);
                UnicodeString::~UnicodeString(&local_2b8);
              }
            }
            else {
              if (*(char *)(local_48 + 0x20) == '\0') {
                if (*(char *)(local_48 + 0x21) == '\0') {
                  ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&rangeLo,L" within ");
                  UnicodeString::UnicodeString(&local_458,'\x01',(ConstChar16Ptr *)&rangeLo,-1);
                  UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_458);
                  UnicodeString::~UnicodeString(&local_458);
                  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&rangeLo);
                }
                else {
                  ConstChar16Ptr::ConstChar16Ptr(&local_418,L" in ");
                  UnicodeString::UnicodeString(&local_410,'\x01',&local_418,-1);
                  UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_410);
                  UnicodeString::~UnicodeString(&local_410);
                  ConstChar16Ptr::~ConstChar16Ptr(&local_418);
                }
              }
              else if (*(char *)(local_48 + 0x21) == '\0') {
                ConstChar16Ptr::ConstChar16Ptr(&local_3d0,L" not within ");
                UnicodeString::UnicodeString(&local_3c8,'\x01',&local_3d0,-1);
                UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_3c8);
                UnicodeString::~UnicodeString(&local_3c8);
                ConstChar16Ptr::~ConstChar16Ptr(&local_3d0);
              }
              else {
                ConstChar16Ptr::ConstChar16Ptr(&local_388,L" not in ");
                UnicodeString::UnicodeString(&local_380,'\x01',&local_388,-1);
                UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_380);
                UnicodeString::~UnicodeString(&local_380);
                ConstChar16Ptr::~ConstChar16Ptr(&local_388);
              }
              for (rangeHi = 0; iVar3 = rangeHi,
                  iVar1 = UVector32::size(*(UVector32 **)(local_48 + 0x18)), iVar3 < iVar1;
                  rangeHi = rangeHi + 2) {
                local_468 = UVector32::elementAti(*(UVector32 **)(local_48 + 0x18),rangeHi);
                local_46c = UVector32::elementAti(*(UVector32 **)(local_48 + 0x18),rangeHi + 1);
                uprv_itou_63((UChar *)&orRule,0x10,local_468,10,0);
                UnicodeString::UnicodeString(&local_4b0,(UChar *)&orRule);
                UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_4b0);
                UnicodeString::~UnicodeString(&local_4b0);
                ConstChar16Ptr::ConstChar16Ptr(&local_4f8,L"..");
                UnicodeString::UnicodeString(&local_4f0,'\x01',&local_4f8,-1);
                UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_4f0);
                UnicodeString::~UnicodeString(&local_4f0);
                ConstChar16Ptr::~ConstChar16Ptr(&local_4f8);
                uprv_itou_63((UChar *)&orRule,0x10,local_46c,10,0);
                UnicodeString::UnicodeString(&local_538,(UChar *)&orRule);
                UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_538);
                UnicodeString::~UnicodeString(&local_538);
                iVar2 = rangeHi + 2;
                iVar3 = UVector32::size(*(UVector32 **)(local_48 + 0x18));
                if (iVar2 < iVar3) {
                  ConstChar16Ptr::ConstChar16Ptr(&local_580,L", ");
                  UnicodeString::UnicodeString(&local_578,'\x01',&local_580,-1);
                  UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_578);
                  UnicodeString::~UnicodeString(&local_578);
                  ConstChar16Ptr::~ConstChar16Ptr(&local_580);
                }
              }
            }
          }
        }
        local_48 = *(long *)(local_48 + 0x28);
        if (local_48 != 0) {
          ConstChar16Ptr::ConstChar16Ptr(&local_5c8,L" and ");
          UnicodeString::UnicodeString(&local_5c0,'\x01',&local_5c8,-1);
          UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_5c0);
          UnicodeString::~UnicodeString(&local_5c0);
          ConstChar16Ptr::~ConstChar16Ptr(&local_5c8);
        }
      }
      andRule = *(AndConstraint **)&andRule->value;
      if (andRule != (AndConstraint *)0x0) {
        ConstChar16Ptr::ConstChar16Ptr(&local_610,L" or ");
        UnicodeString::UnicodeString(&local_608,'\x01',&local_610,-1);
        UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_608);
        UnicodeString::~UnicodeString(&local_608);
        ConstChar16Ptr::~ConstChar16Ptr(&local_610);
      }
    }
  }
  if (this->fNext != (RuleChain *)0x0) {
    ConstChar16Ptr::ConstChar16Ptr(&local_658,L"; ");
    UnicodeString::UnicodeString(&local_650,'\x01',&local_658,-1);
    UnicodeString::operator+=((UnicodeString *)digitString._24_8_,&local_650);
    UnicodeString::~UnicodeString(&local_650);
    ConstChar16Ptr::~ConstChar16Ptr(&local_658);
    dumpRules(this->fNext,(UnicodeString *)digitString._24_8_);
  }
  return;
}

Assistant:

void
RuleChain::dumpRules(UnicodeString& result) {
    UChar digitString[16];

    if ( ruleHeader != nullptr ) {
        result +=  fKeyword;
        result += COLON;
        result += SPACE;
        OrConstraint* orRule=ruleHeader;
        while ( orRule != nullptr ) {
            AndConstraint* andRule=orRule->childNode;
            while ( andRule != nullptr ) {
                if ((andRule->op==AndConstraint::NONE) &&  (andRule->rangeList==nullptr) && (andRule->value == -1)) {
                    // Empty Rules.
                } else if ( (andRule->op==AndConstraint::NONE) && (andRule->rangeList==nullptr) ) {
                    result += tokenString(andRule->digitsType);
                    result += UNICODE_STRING_SIMPLE(" is ");
                    if (andRule->negated) {
                        result += UNICODE_STRING_SIMPLE("not ");
                    }
                    uprv_itou(digitString,16, andRule->value,10,0);
                    result += UnicodeString(digitString);
                }
                else {
                    result += tokenString(andRule->digitsType);
                    result += SPACE;
                    if (andRule->op==AndConstraint::MOD) {
                        result += UNICODE_STRING_SIMPLE("mod ");
                        uprv_itou(digitString,16, andRule->opNum,10,0);
                        result += UnicodeString(digitString);
                    }
                    if (andRule->rangeList==nullptr) {
                        if (andRule->negated) {
                            result += UNICODE_STRING_SIMPLE(" is not ");
                            uprv_itou(digitString,16, andRule->value,10,0);
                            result += UnicodeString(digitString);
                        }
                        else {
                            result += UNICODE_STRING_SIMPLE(" is ");
                            uprv_itou(digitString,16, andRule->value,10,0);
                            result += UnicodeString(digitString);
                        }
                    }
                    else {
                        if (andRule->negated) {
                            if ( andRule->integerOnly ) {
                                result += UNICODE_STRING_SIMPLE(" not in ");
                            }
                            else {
                                result += UNICODE_STRING_SIMPLE(" not within ");
                            }
                        }
                        else {
                            if ( andRule->integerOnly ) {
                                result += UNICODE_STRING_SIMPLE(" in ");
                            }
                            else {
                                result += UNICODE_STRING_SIMPLE(" within ");
                            }
                        }
                        for (int32_t r=0; r<andRule->rangeList->size(); r+=2) {
                            int32_t rangeLo = andRule->rangeList->elementAti(r);
                            int32_t rangeHi = andRule->rangeList->elementAti(r+1);
                            uprv_itou(digitString,16, rangeLo, 10, 0);
                            result += UnicodeString(digitString);
                            result += UNICODE_STRING_SIMPLE("..");
                            uprv_itou(digitString,16, rangeHi, 10,0);
                            result += UnicodeString(digitString);
                            if (r+2 < andRule->rangeList->size()) {
                                result += UNICODE_STRING_SIMPLE(", ");
                            }
                        }
                    }
                }
                if ( (andRule=andRule->next) != nullptr) {
                    result += UNICODE_STRING_SIMPLE(" and ");
                }
            }
            if ( (orRule = orRule->next) != nullptr ) {
                result += UNICODE_STRING_SIMPLE(" or ");
            }
        }
    }
    if ( fNext != nullptr ) {
        result += UNICODE_STRING_SIMPLE("; ");
        fNext->dumpRules(result);
    }
}